

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

void tc_uECC_vli_mult(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                     wordcount_t num_words)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  undefined7 in_register_00000009;
  tc_uECC_word_t *ptVar6;
  byte bVar7;
  tc_uECC_word_t *ptVar8;
  ulong uVar9;
  byte bVar10;
  char cVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  
  uVar4 = CONCAT71(in_register_00000009,num_words);
  iVar1 = (int)uVar4;
  if (num_words < '\x01') {
    iVar1 = 0;
  }
  bVar10 = 1;
  lVar13 = 0;
  uVar2 = 0;
  uVar9 = 0;
  ptVar6 = right;
  while( true ) {
    bVar7 = bVar10;
    if ((char)bVar10 < '\x01') {
      bVar7 = 0;
    }
    if (lVar13 == iVar1) break;
    lVar12 = 0;
    uVar3 = uVar2;
    ptVar8 = left;
    uVar2 = uVar9;
    uVar9 = 0;
    while( true ) {
      if (-lVar12 == (ulong)bVar7) break;
      uVar2 = uVar3 & 0xffffffff | uVar2 << 0x20;
      uVar3 = uVar2 + (ulong)ptVar6[lVar12] * (ulong)*ptVar8;
      uVar9 = (ulong)((int)uVar9 + (uint)CARRY8(uVar2,(ulong)ptVar6[lVar12] * (ulong)*ptVar8));
      uVar2 = uVar3 >> 0x20;
      lVar12 = lVar12 + -1;
      ptVar8 = ptVar8 + 1;
    }
    result[lVar13] = (tc_uECC_word_t)uVar3;
    lVar13 = lVar13 + 1;
    bVar10 = bVar10 + 1;
    ptVar6 = ptVar6 + 1;
  }
  iVar1 = num_words * 2 + -1;
  cVar11 = '\x01';
  while (cVar5 = (char)uVar4, cVar5 < iVar1) {
    lVar13 = (long)cVar11;
    puVar14 = right + (cVar5 - lVar13);
    uVar4 = uVar2;
    uVar2 = uVar9;
    uVar9 = 0;
    while( true ) {
      if (num_words <= lVar13) break;
      uVar2 = uVar4 & 0xffffffff | uVar2 << 0x20;
      uVar4 = uVar2 + (ulong)*puVar14 * (ulong)left[lVar13];
      uVar9 = (ulong)((int)uVar9 + (uint)CARRY8(uVar2,(ulong)*puVar14 * (ulong)left[lVar13]));
      uVar2 = uVar4 >> 0x20;
      lVar13 = lVar13 + 1;
      puVar14 = puVar14 + -1;
    }
    result[cVar5] = (tc_uECC_word_t)uVar4;
    cVar11 = cVar11 + '\x01';
    uVar4 = (ulong)(byte)(cVar5 + 1);
  }
  result[iVar1] = (tc_uECC_word_t)uVar2;
  return;
}

Assistant:

static void tc_uECC_vli_mult(tc_uECC_word_t *result, const tc_uECC_word_t *left,
			  const tc_uECC_word_t *right, wordcount_t num_words)
{

	tc_uECC_word_t r0 = 0;
	tc_uECC_word_t r1 = 0;
	tc_uECC_word_t r2 = 0;
	wordcount_t i, k;

	/* Compute each digit of result in sequence, maintaining the carries. */
	for (k = 0; k < num_words; ++k) {

		for (i = 0; i <= k; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}

		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}

	for (k = num_words; k < num_words * 2 - 1; ++k) {

		for (i = (k + 1) - num_words; i < num_words; ++i) {
			muladd(left[i], right[k - i], &r0, &r1, &r2);
		}
		result[k] = r0;
		r0 = r1;
		r1 = r2;
		r2 = 0;
	}
	result[num_words * 2 - 1] = r0;
}